

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# futex.h
# Opt level: O1

int absl::synchronization_internal::FutexImpl::WaitAbsoluteTimeout
              (atomic<int> *v,int32_t val,timespec *abs_timeout)

{
  long lVar1;
  int *piVar2;
  int iVar3;
  __time_t *p_Var4;
  FutexTimespec ts;
  __time_t local_18;
  __syscall_slong_t local_10;
  
  iVar3 = 0;
  if (abs_timeout == (timespec *)0x0) {
    p_Var4 = (__time_t *)0x0;
  }
  else {
    local_18 = abs_timeout->tv_sec;
    p_Var4 = &local_18;
    local_10 = abs_timeout->tv_nsec;
  }
  lVar1 = syscall(0xca,v,0x189,val,p_Var4,0,0xffffffff);
  if (lVar1 != 0) {
    piVar2 = __errno_location();
    iVar3 = -*piVar2;
  }
  return iVar3;
}

Assistant:

static int WaitAbsoluteTimeout(std::atomic<int32_t>* v, int32_t val,
                                 const struct timespec* abs_timeout) {
    FutexTimespec ts;
    // https://locklessinc.com/articles/futex_cheat_sheet/
    // Unlike FUTEX_WAIT, FUTEX_WAIT_BITSET uses absolute time.
    auto err = syscall(
        SYS_futex, reinterpret_cast<int32_t*>(v),
        FUTEX_WAIT_BITSET | FUTEX_PRIVATE_FLAG | FUTEX_CLOCK_REALTIME, val,
        ToFutexTimespec(abs_timeout, &ts), nullptr, FUTEX_BITSET_MATCH_ANY);
    if (err != 0) {
      return -errno;
    }
    return 0;
  }